

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpParser.cpp
# Opt level: O1

void __thiscall brynet::net::HTTPParser::HTTPParser(HTTPParser *this,http_parser_type parserType)

{
  _Rb_tree_header *p_Var1;
  
  this->mParserType = parserType;
  (this->mCurrentField)._M_dataplus._M_p = (pointer)&(this->mCurrentField).field_2;
  (this->mCurrentField)._M_string_length = 0;
  (this->mCurrentField).field_2._M_local_buf[0] = '\0';
  (this->mCurrentValue)._M_dataplus._M_p = (pointer)&(this->mCurrentValue).field_2;
  (this->mCurrentValue)._M_string_length = 0;
  (this->mCurrentValue).field_2._M_local_buf[0] = '\0';
  (this->mPath)._M_dataplus._M_p = (pointer)&(this->mPath).field_2;
  (this->mPath)._M_string_length = 0;
  (this->mPath).field_2._M_local_buf[0] = '\0';
  (this->mQuery)._M_dataplus._M_p = (pointer)&(this->mQuery).field_2;
  (this->mQuery)._M_string_length = 0;
  (this->mQuery).field_2._M_local_buf[0] = '\0';
  (this->mStatus)._M_dataplus._M_p = (pointer)&(this->mStatus).field_2;
  (this->mStatus)._M_string_length = 0;
  (this->mStatus).field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->mHeadValues)._M_t._M_impl.super__Rb_tree_header;
  (this->mHeadValues)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->mHeadValues)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->mHeadValues)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->mHeadValues)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->mHeadValues)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->mUrl)._M_dataplus._M_p = (pointer)&(this->mUrl).field_2;
  (this->mUrl)._M_string_length = 0;
  (this->mUrl).field_2._M_local_buf[0] = '\0';
  (this->mBody)._M_dataplus._M_p = (pointer)&(this->mBody).field_2;
  (this->mBody)._M_string_length = 0;
  (this->mBody).field_2._M_local_buf[0] = '\0';
  (this->mWSCacheFrame)._M_dataplus._M_p = (pointer)&(this->mWSCacheFrame).field_2;
  (this->mWSCacheFrame)._M_string_length = 0;
  (this->mWSCacheFrame).field_2._M_local_buf[0] = '\0';
  (this->mWSParsePayload)._M_dataplus._M_p = (pointer)&(this->mWSParsePayload).field_2;
  (this->mWSParsePayload)._M_string_length = 0;
  (this->mWSParsePayload).field_2._M_local_buf[0] = '\0';
  this->mIsWebSocket = false;
  this->mIsKeepAlive = false;
  this->mISCompleted = false;
  this->mLastWasValue = true;
  (this->mSettings).on_status = sStatusHandle;
  (this->mSettings).on_body = sBodyHandle;
  (this->mSettings).on_url = sUrlHandle;
  (this->mSettings).on_header_field = sHeadField;
  (this->mSettings).on_header_value = sHeadValue;
  (this->mSettings).on_headers_complete = sHeadComplete;
  (this->mSettings).on_message_begin = sMessageBegin;
  (this->mSettings).on_message_complete = sMessageEnd;
  (this->mSettings).on_chunk_header = sChunkHeader;
  (this->mSettings).on_chunk_complete = sChunkComplete;
  (this->mParser).data = this;
  http_parser_init(&this->mParser,parserType);
  return;
}

Assistant:

HTTPParser::HTTPParser(http_parser_type parserType) : mParserType(parserType)
{
    mLastWasValue = true;

    mIsWebSocket = false;
    mIsKeepAlive = false;
    mISCompleted = false;
    mSettings.on_status = sStatusHandle;
    mSettings.on_body = sBodyHandle;
    mSettings.on_url = sUrlHandle;
    mSettings.on_header_field = sHeadField;
    mSettings.on_header_value = sHeadValue;
    mSettings.on_headers_complete = sHeadComplete;
    mSettings.on_message_begin = sMessageBegin;
    mSettings.on_message_complete = sMessageEnd;
    mSettings.on_chunk_header = sChunkHeader;
    mSettings.on_chunk_complete = sChunkComplete;
    mParser.data = this;

    http_parser_init(&mParser, mParserType);
}